

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  SrcItem *__src;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int p2;
  Parse *pParse;
  Vdbe *p;
  WhereRightJoin *pWVar4;
  WhereLoop *pWVar5;
  Subquery *pSVar6;
  ulong uVar7;
  WhereTerm *pWVar8;
  Table *pTab;
  Index *pIVar9;
  int iVar10;
  int iVar11;
  Expr *pEVar12;
  WhereInfo *pWInfo_00;
  Index **ppIVar13;
  Op *pOVar14;
  uint p4;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long in_FS_OFFSET;
  Expr *local_c0;
  SrcList local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar4 = pLevel->pRJ;
  pWVar5 = pLevel->pWLoop;
  __src = pWInfo->pTabList->a + pLevel->iFrom;
  uVar16 = 0;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s");
  if (0 < iLevel) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      bVar1 = (&pWInfo->a[0].iFrom)[lVar15];
      uVar16 = uVar16 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + lVar15) + 8);
      if ((pWInfo->pTabList->a[bVar1].fg.field_0x1 & 0x40) != 0) {
        pSVar6 = pWInfo->pTabList->a[bVar1].u4.pSubq;
        iVar10 = pSVar6->regResult;
        sqlite3VdbeAddOp3(p,0x4b,0,iVar10,iVar10 + pSVar6->pSelect->pEList->nExpr + -1);
      }
      sqlite3VdbeAddOp3(p,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + lVar15),0,0);
      iVar10 = *(int *)((long)&pWInfo->a[0].iIdxCur + lVar15);
      if (iVar10 != 0) {
        sqlite3VdbeAddOp3(p,0x88,iVar10,0,0);
      }
      lVar15 = lVar15 + 0x70;
    } while ((ulong)(uint)iLevel * 0x70 - lVar15 != 0);
  }
  if ((((__src->fg).jointype & 0x40) == 0) && (iVar10 = (pWInfo->sWC).nTerm, 0 < iVar10)) {
    uVar7 = pWVar5->maskSelf;
    lVar17 = 0;
    lVar15 = 0;
    local_c0 = (Expr *)0x0;
    do {
      pWVar8 = (pWInfo->sWC).a;
      if (((*(ushort *)((long)&pWVar8->wtFlags + lVar17) & 0x8002) != 0) &&
         (*(short *)((long)&pWVar8->eOperator + lVar17) != 0x2000)) break;
      if (((*(ulong *)((long)&pWVar8->prereqAll + lVar17) & ~(uVar16 | uVar7)) == 0) &&
         (pEVar12 = *(Expr **)((long)&pWVar8->pExpr + lVar17), (pEVar12->flags & 3) == 0)) {
        pEVar12 = exprDup(pParse->db,pEVar12,0,(EdupBuf *)0x0);
        local_c0 = sqlite3ExprAnd(pParse,local_c0,pEVar12);
        iVar10 = (pWInfo->sWC).nTerm;
      }
      lVar15 = lVar15 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar15 < iVar10);
  }
  else {
    local_c0 = (Expr *)0x0;
  }
  local_88.nSrc = 1;
  local_88.nAlloc = 1;
  memcpy(local_88.a,__src,0x48);
  local_88.a[0].fg.jointype = '\0';
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&local_88,local_c0,(ExprList *)0x0,(ExprList *)0x0,
                                (Select *)0x0,0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar11 = pLevel->iTabCur;
    iVar3 = pParse->nMem;
    iVar10 = iVar3 + 1;
    pParse->nMem = iVar10;
    p2 = pWInfo_00->iContinue;
    pTab = __src->pSTab;
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp3(p,0x87,iVar11,iVar10,0);
      p4 = 1;
    }
    else {
      ppIVar13 = &pTab->pIndex;
      do {
        pIVar9 = *ppIVar13;
        ppIVar13 = &pIVar9->pNext;
      } while ((*(ushort *)&pIVar9->field_0x63 & 3) != 2);
      uVar2 = pIVar9->nKeyCol;
      pParse->nMem = iVar3 + (uint)uVar2;
      p4 = (uint)uVar2;
      if (uVar2 == 0) {
        p4 = 0;
      }
      else {
        uVar16 = 0;
        do {
          sqlite3ExprCodeGetColumnOfTable
                    (p,pTab,iVar11,(int)pIVar9->aiColumn[uVar16],(int)uVar16 + iVar10);
          uVar16 = uVar16 + 1;
        } while (p4 != uVar16);
      }
    }
    iVar11 = sqlite3VdbeAddOp4Int(p,0x40,pWVar4->regBloom,0,iVar10,p4);
    sqlite3VdbeAddOp4Int(p,0x1d,pWVar4->iMatch,p2,iVar10,p4);
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp + iVar11;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,10,pWVar4->regReturn,pWVar4->addrSubrtn,0);
    sqlite3WhereEnd(pWInfo_00);
  }
  if (local_c0 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_c0);
  }
  if ((long)pParse->addrExplain == 0) {
    iVar10 = 0;
  }
  else {
    if (pParse->pVdbe->db->mallocFailed == '\0') {
      pOVar14 = pParse->pVdbe->aOp + pParse->addrExplain;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    iVar10 = pOVar14->p2;
  }
  pParse->addrExplain = iVar10;
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pSTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    SrcItem *pRight;
    assert( pWInfo->a[k].pWLoop->iTab == pWInfo->a[k].iFrom );
    pRight = &pWInfo->pTabList->a[pWInfo->a[k].iFrom];
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    if( pRight->fg.viaCoroutine ){
      Subquery *pSubq;
      assert( pRight->fg.isSubquery && pRight->u4.pSubq!=0 );
      pSubq = pRight->u4.pSubq;
      assert( pSubq->pSelect!=0 && pSubq->pSelect->pEList!=0 );
      sqlite3VdbeAddOp3(
          v, OP_Null, 0, pSubq->regResult,
          pSubq->regResult + pSubq->pSelect->pEList->nExpr-1
      );
    }
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pSTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}